

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_manager.hpp
# Opt level: O1

string * __thiscall
duckdb::ErrorManager::FormatExceptionRecursive<std::__cxx11::string>
          (string *__return_storage_ptr__,ErrorManager *this,ErrorType error_type,
          vector<duckdb::ExceptionFormatValue,_true> *values,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param)

{
  pointer pcVar1;
  string *value;
  undefined1 local_88 [56];
  char *local_50;
  char local_40 [16];
  
  pcVar1 = (param->_M_dataplus)._M_p;
  local_88._0_8_ = local_88 + 0x10;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,pcVar1 + param->_M_string_length);
  ExceptionFormatValue::CreateFormatValue<std::__cxx11::string>
            ((ExceptionFormatValue *)(local_88 + 0x20),(ExceptionFormatValue *)local_88,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            (&values->
              super_vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
             ,(ExceptionFormatValue *)(local_88 + 0x20));
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_);
  }
  FormatExceptionRecursive_abi_cxx11_(__return_storage_ptr__,this,error_type,values);
  return __return_storage_ptr__;
}

Assistant:

string FormatExceptionRecursive(ErrorType error_type, vector<ExceptionFormatValue> &values, T param,
	                                ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return FormatExceptionRecursive(error_type, values, params...);
	}